

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::_List_iterator<cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::_List_iterator<cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
::alloc<std::_List_iterator<cs_impl::any>&>
          (allocator_type<cs_impl::any::holder<std::_List_iterator<cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
           *this,_List_iterator<cs_impl::any> *args)

{
  long lVar1;
  holder<std::_List_iterator<cs_impl::any>_> *phVar2;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar2 = (holder<std::_List_iterator<cs_impl::any>_> *)operator_new(0x10);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar2 = *(holder<std::_List_iterator<cs_impl::any>_> **)(this + lVar1 * 8 + -8);
  }
  (phVar2->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_0024e7b0;
  (phVar2->mDat)._M_node = args->_M_node;
  return phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}